

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void duckdb_brotli::BrotliBootstrapFree(void *address,MemoryManager *m)

{
  long in_RSI;
  long in_RDI;
  void *opaque;
  brotli_free_func free_func;
  
  if (in_RDI != 0) {
    (**(code **)(in_RSI + 8))(*(undefined8 *)(in_RSI + 0x10),in_RDI);
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliBootstrapFree(void* address, MemoryManager* m) {
  if (!address) {
    /* Should not happen! */
    return;
  } else {
    /* Copy values, as those would be freed. */
    brotli_free_func free_func = m->free_func;
    void* opaque = m->opaque;
    free_func(opaque, address);
  }
}